

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *p)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  Fra_Sml_t *p_00;
  int iVar4;
  long lVar5;
  int iVar6;
  uint *puVar7;
  int iVar8;
  double dVar9;
  
  pVVar1 = p->pCla->vImps;
  dVar9 = 0.0;
  if ((pVVar1 != (Vec_Int_t *)0x0) && (pVVar1->nSize != 0)) {
    iVar6 = 0;
    p_00 = Fra_SmlSimulateComb(p->pManAig,0x40,0);
    if (*(int *)&p_00[1].pAig != 0) {
      __assert_fail("pResult[0] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraImp.c"
                    ,0x281,"double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *)");
    }
    for (; pVVar1 = p->pCla->vImps, iVar6 < pVVar1->nSize; iVar6 = iVar6 + 1) {
      uVar2 = Vec_IntEntry(pVVar1,iVar6);
      iVar8 = p_00->nWordsTotal;
      iVar4 = (uVar2 & 0xffff) * iVar8;
      iVar3 = ((int)uVar2 >> 0x10) * iVar8;
      lVar5 = (long)p_00->nWordsPref;
      puVar7 = (uint *)((long)&p_00[1].pAig + lVar5 * 4);
      for (; lVar5 < iVar8; lVar5 = lVar5 + 1) {
        *puVar7 = *puVar7 | ~puVar7[iVar3] & puVar7[iVar4];
        iVar8 = p_00->nWordsTotal;
        puVar7 = puVar7 + 1;
      }
    }
    iVar6 = Fra_SmlCountOnesOne(p_00,0);
    dVar9 = ((double)iVar6 * 100.0) / (double)((p_00->nWordsTotal - p_00->nWordsPref) * 0x20);
    Fra_SmlStop(p_00);
  }
  return dVar9;
}

Assistant:

double Fra_ImpComputeStateSpaceRatio( Fra_Man_t * p )
{
    int nSimWords = 64;
    Fra_Sml_t * pComb;
    unsigned * pResult;
    double Ratio = 0.0;
    int Left, Right, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return Ratio;
    // simulate the AIG manager with combinational patterns
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    // go through the implications and collect where they do not hold
    pResult = Fra_ObjSim( pComb, 0 );
    assert( pResult[0] == 0 );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Sml_NodeSaveNotImpPatterns( pComb, Left, Right, pResult );
    }
    // count the number of ones in this area
    Ratio = 100.0 * Fra_SmlCountOnesOne( pComb, 0 ) / (32*(pComb->nWordsTotal-pComb->nWordsPref));
    Fra_SmlStop( pComb );
    return Ratio;
}